

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O0

QLayoutItem * __thiscall QDockWidgetLayout::takeAt(QDockWidgetLayout *this,int index)

{
  QLayoutItem *pQVar1;
  long i_00;
  qsizetype qVar2;
  const_reference ppQVar3;
  reference ppQVar4;
  int in_ESI;
  QList<QLayoutItem_*> *in_RDI;
  QLayoutItem *item;
  int i;
  int j;
  int local_1c;
  int local_18;
  
  local_18 = 0;
  local_1c = 0;
  do {
    i_00 = (long)local_1c;
    qVar2 = QList<QLayoutItem_*>::size((QList<QLayoutItem_*> *)&in_RDI[1].d.ptr);
    if (qVar2 <= i_00) {
      return (QLayoutItem *)0x0;
    }
    ppQVar3 = QList<QLayoutItem_*>::at(in_RDI,i_00);
    pQVar1 = *ppQVar3;
    if (pQVar1 != (QLayoutItem *)0x0) {
      if (in_ESI == local_18) {
        ppQVar4 = QList<QLayoutItem_*>::operator[](in_RDI,i_00);
        *ppQVar4 = (QLayoutItem *)0x0;
        (**(code **)&(in_RDI->d).d[7].super_QArrayData)();
        return pQVar1;
      }
      local_18 = local_18 + 1;
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

QLayoutItem *QDockWidgetLayout::takeAt(int index)
{
    int j = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == j) {
            item_list[i] = 0;
            invalidate();
            return item;
        }
        ++j;
    }
    return nullptr;
}